

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

bool __thiscall CConsole::LineIsValid(CConsole *this,char *pStr)

{
  char cVar1;
  long lVar2;
  int iVar3;
  CCommand *pCVar4;
  char *pcVar5;
  char *pcVar6;
  CConsole *pCVar7;
  long in_FS_OFFSET;
  bool bVar8;
  CResult Result;
  
  Result.m_apArgs[1] = (char *)0x0;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (pStr == (char *)0x0) {
    bVar8 = false;
  }
  else {
    bVar8 = true;
    if ((*pStr != '\0') && (*pStr != '#')) {
LAB_001b940d:
      Result.super_IResult.m_NumArgs = 0;
      Result.super_IResult._vptr_IResult = (_func_int **)&PTR__IResult_002156c0;
      mem_zero(Result.m_aStringStorage,0x401);
      Result.m_pArgsStart = (char *)0x0;
      Result.m_pCommand = (char *)0x0;
      pCVar7 = (CConsole *)Result.m_apArgs;
      mem_zero(Result.m_apArgs,0x1000);
      pcVar6 = (char *)0x0;
      pcVar5 = pStr;
      do {
        cVar1 = *pcVar5;
        if (cVar1 == '\"') {
          pcVar6 = (char *)(ulong)((uint)pcVar6 ^ 1);
        }
        else if (cVar1 == '\\') {
          if (pcVar5[1] == '\"') {
            pcVar5 = pcVar5 + 1;
          }
        }
        else {
          if (cVar1 == '\0') {
            pcVar6 = (char *)0x0;
            goto LAB_001b9490;
          }
          if ((uint)pcVar6 == 0) {
            pcVar6 = (char *)0x0;
            if (cVar1 == '#') goto LAB_001b9490;
            if (cVar1 == ';') goto LAB_001b948c;
          }
          else {
            pcVar6 = (char *)0x1;
          }
        }
        pcVar5 = pcVar5 + 1;
      } while( true );
    }
  }
LAB_001b94e7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return bVar8;
LAB_001b948c:
  pcVar6 = pcVar5 + 1;
LAB_001b9490:
  ParseStart(pCVar7,&Result,pStr,((int)pcVar5 - (int)pStr) + 1);
  pCVar7 = this;
  pCVar4 = FindCommand(this,Result.m_pCommand,this->m_FlagMask);
  if (pCVar4 == (CCommand *)0x0) {
    bVar8 = false;
  }
  else {
    iVar3 = ParseArgs(pCVar7,&Result,(pCVar4->super_CCommandInfo).m_pParams);
    bVar8 = iVar3 == 0;
    if (bVar8) {
      pStr = pcVar6;
    }
  }
  if (((bVar8 == false) || (pStr == (char *)0x0)) || (*pStr == '\0')) goto LAB_001b94e7;
  goto LAB_001b940d;
}

Assistant:

bool CConsole::LineIsValid(const char *pStr)
{
	if(!pStr)
		return false;

	// Comments and empty lines are valid commands
	if(*pStr == '#' || *pStr == '\0')
		return true;

	do
	{
		CResult Result;
		const char *pEnd = pStr;
		const char *pNextPart = 0;
		int InString = 0;

		while(*pEnd)
		{
			if(*pEnd == '"')
				InString ^= 1;
			else if(*pEnd == '\\') // escape sequences
			{
				if(pEnd[1] == '"')
					pEnd++;
			}
			else if(!InString)
			{
				if(*pEnd == ';') // command separator
				{
					pNextPart = pEnd+1;
					break;
				}
				else if(*pEnd == '#') // comment, no need to do anything more
					break;
			}

			pEnd++;
		}

		if(ParseStart(&Result, pStr, (pEnd-pStr) + 1) != 0)
			return false;

		CCommand *pCommand = FindCommand(Result.m_pCommand, m_FlagMask);
		if(!pCommand || ParseArgs(&Result, pCommand->m_pParams))
			return false;

		pStr = pNextPart;
	}
	while(pStr && *pStr);

	return true;
}